

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateProcessCommunications(HelicsFederate fed,HelicsTime period,HelicsError *err)

{
  Federate *this;
  baseType bVar1;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    bVar1 = count_time<9,_long>::convert(period);
    helics::Federate::processCommunication(this,(milliseconds)(bVar1 / 1000000));
  }
  return;
}

Assistant:

void helicsFederateProcessCommunications(HelicsFederate fed, HelicsTime period, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->processCommunication(helics::Time(period).to_ms());
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}